

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

int __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::bind
          (reactive_socket_service<asio::ip::udp> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  sockaddr *__addr_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  
  __addr_00 = (sockaddr *)0x1c;
  if (__addr->sa_family == 2) {
    __addr_00 = (sockaddr *)0x10;
  }
  socket_ops::bind((socket_ops *)(ulong)*(uint *)CONCAT44(in_register_00000034,__fd),(int)__addr,
                   __addr_00,__len);
  return *(int *)CONCAT44(in_register_0000000c,__len);
}

Assistant:

asio::error_code bind(implementation_type& impl,
      const endpoint_type& endpoint, asio::error_code& ec)
  {
    socket_ops::bind(impl.socket_, endpoint.data(), endpoint.size(), ec);
    return ec;
  }